

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

void __thiscall n_pca::NPca::process(NPca *this)

{
  Index *__return_storage_ptr__;
  Scalar *data;
  Index IVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  long lVar2;
  MatrixXd *this_01;
  Scalar __x;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_328;
  ColXpr local_318;
  ColXpr local_2e0;
  double local_2a8;
  ColXpr local_2a0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_268;
  int local_20c;
  ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> AStack_208;
  int i;
  SquareReturnType local_200;
  undefined1 local_1f0 [8];
  MatrixXd basic_squre_matrix;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_1d0;
  Type local_1c0;
  undefined1 local_188 [8];
  MatrixXd PC;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eigenSolver;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_118;
  undefined1 local_108 [8];
  MatrixXd C;
  undefined1 local_e8 [8];
  MatrixXd train_zero_matrix;
  undefined1 local_b0 [8];
  RowVectorXd mean_vec_row;
  MeanReturnType local_98;
  string local_60 [48];
  string local_30 [32];
  NPca *local_10;
  NPca *this_local;
  
  local_10 = this;
  std::__cxx11::string::string(local_30,(string *)&this->n_config_->train_file_path_);
  setTrainMatrix(this,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_60,(string *)&this->n_config_->test_file_path_);
  setTestMatrix(this,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  printf("finished load set...\n");
  this_01 = &this->train_matrix_;
  mean_vec_row.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::mean
            (&local_98,
             (VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
             &mean_vec_row.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->train_mean_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
              *)&local_98);
  data = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
                   (&(this->train_mean_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  __return_storage_ptr__ =
       &train_zero_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
        .m_cols;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Map
            ((MapType *)__return_storage_ptr__,data,IVar1);
  Eigen::Matrix<double,1,-1,1,1,-1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>
            ((Matrix<double,1,_1,1,1,_1> *)local_b0,
             (Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)
             __return_storage_ptr__);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_e8,this_01);
  C.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e8);
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-=
            ((VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)
             &C.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_b0);
  eigenSolver._72_8_ =
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e8);
  local_118 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e8,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&eigenSolver.m_info);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_108,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_118);
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             &PC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_108,0x80);
  this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                      ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &PC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rightCols<int>
            (&local_1c0,this_00,this->n_config_->dimension_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,true>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_188,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>
              *)&local_1c0);
  printf("finished reduce dimension...\n");
  basic_squre_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e8);
  local_1d0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                         &basic_squre_matrix.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_188
                        );
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->basic_matrix_,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_1d0);
  AStack_208 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                         ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          &this->basic_matrix_);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::square
            (&local_200,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &stack0xfffffffffffffdf8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_1f0,
             (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_200);
  local_20c = 0;
  while( true ) {
    lVar2 = (long)local_20c;
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->basic_matrix_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar1 <= lVar2) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_2a0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->basic_matrix_,
               (long)local_20c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_2e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0,
               (long)local_20c);
    __x = Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
          sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
              &local_2e0);
    local_2a8 = sqrt(__x);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator/
              (&local_268,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_2a0
               ,&local_2a8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_318,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->basic_matrix_,
               (long)local_20c);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_318,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_268);
    local_20c = local_20c + 1;
  }
  local_328 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e8,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         &this->basic_matrix_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->train_data_matrix_,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_328);
  printf("finished process...\n");
  saveData(this);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_188);
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~SelfAdjointEigenSolver
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &PC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_108);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e8);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_b0);
  return;
}

Assistant:

void NPca::process()
{
    setTrainMatrix(n_config_->train_file_path_);
    setTestMatrix(n_config_->test_file_path_);

    printf("finished load set...\n");

    train_mean_ = train_matrix_.colwise().mean();

    RowVectorXd mean_vec_row(RowVectorXd::Map(train_mean_.data(), train_matrix_.cols()));

    MatrixXd train_zero_matrix = train_matrix_;
    train_zero_matrix.rowwise() -= mean_vec_row;

    // calculate covariance
    MatrixXd C = train_zero_matrix * train_zero_matrix.transpose();

    // calculate feature vector and value
    Eigen::SelfAdjointEigenSolver<MatrixXd> eigenSolver(C);

    // reduce dimension
    MatrixXd PC = eigenSolver.eigenvectors().rightCols(n_config_->dimension_);
    printf("finished reduce dimension...\n");

    basic_matrix_ = train_zero_matrix.transpose() * PC;

    MatrixXd basic_squre_matrix = basic_matrix_.array().square();

    // normalization
    for (int i = 0; i < basic_matrix_.cols(); i++)
    {
        basic_matrix_.col(i) = basic_matrix_.col(i)/sqrt(basic_squre_matrix.col(i).sum());
    }

    train_data_matrix_ = train_zero_matrix * basic_matrix_;

    printf("finished process...\n");

    saveData();
}